

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void __thiscall
gimage::TIFFImageIO::load
          (TIFFImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  uint uVar1;
  unsigned_short ***pppuVar2;
  int iVar3;
  IOException *pIVar4;
  long lVar5;
  uint16_t d;
  ushort d_00;
  long lVar6;
  long lVar7;
  long lVar8;
  long k;
  ulong uVar9;
  long k_1;
  allocator local_1f9;
  ulong local_1f8;
  long local_1f0;
  long local_1e8;
  uint16_t format;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixel;
  uint16_t planar;
  ulong local_168;
  TiffImage<unsigned_short> tif;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar9 = (ulong)(uint)ds;
  local_1f0 = x;
  local_1e8 = y;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image(&tif.rows,0,0,1);
  tif.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tif.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tif.row.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tif.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tif.row.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tif.row.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tif.tif = (TIFF *)TIFFOpen(name,"r");
  if (tif.tif == (TIFF *)0x0) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&pixel,name,(allocator *)&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,
                   "Can only load TIFF image (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixel);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,")")
    ;
    gutil::IOException::IOException(pIVar4,(string *)&format);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFGetField(tif.tif,0x100,&tif.width);
  TIFFGetField(tif.tif,0x101);
  TIFFGetField(tif.tif,0x115);
  TIFFGetField(tif.tif,0x102);
  TIFFGetField(tif.tif,0x153,&format);
  TIFFGetField(tif.tif,0x11c,&planar);
  tif.is_float = format == 3;
  tif.is_planar = planar == 2;
  tif.raw_size = TIFFScanlineSize(tif.tif);
  TIFFGetField(tif.tif,0x106);
  if (0x10 < tif.bits) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_70,name,&local_1f9);
    std::operator+(&local_50,"Image ",&local_70);
    std::operator+(&local_d0,&local_50," has ");
    std::__cxx11::to_string(&local_90,(uint)tif.bits);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixel,
                   &local_d0,&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixel,
                   " bits per sample, but target image only ");
    std::__cxx11::to_string(&local_b0,0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar,
                   &local_b0);
    gutil::IOException::IOException(pIVar4,(string *)&format);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_1f8 = w;
  if (w < 0) {
    local_1f8 = (ulong)((tif.width + ds) - 1) / (ulong)(uint)ds;
  }
  if (h < 0) {
    h = ((tif.height + ds) - 1) / uVar9;
  }
  if (tif.photometric < 3) {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              (image,(ulong)tif.width,(ulong)tif.height,(ulong)tif.depth);
    local_168 = uVar9;
    if (tif.is_planar == false) {
      for (uVar9 = 0; h != uVar9; uVar9 = uVar9 + 1) {
        anon_unknown_6::readRow<unsigned_short>(image,(uint32_t)uVar9,&tif,(uint32_t)uVar9,0);
      }
    }
    else {
      for (d_00 = 0; d_00 < tif.depth; d_00 = d_00 + 1) {
        for (uVar9 = 0; h != uVar9; uVar9 = uVar9 + 1) {
          anon_unknown_6::readRow<unsigned_short>(image,(uint32_t)uVar9,&tif,(uint32_t)uVar9,d_00);
        }
      }
    }
    if (1 < (int)local_168) {
      downscaleImage<unsigned_short>
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format,image,
                 (int)local_168);
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::operator=
                (image,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format);
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format);
    }
    if (((local_1e8 == 0 && local_1f0 == 0) && (local_1f8 == image->width)) && (h == image->height))
    goto LAB_0013d080;
    cropImage<unsigned_short>
              ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format,image,
               local_1f0,local_1e8,local_1f8,h);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pixel,(ulong)(tif.height * tif.width),(allocator_type *)&format);
    iVar3 = TIFFReadRGBAImageOriented
                      (tif.tif,tif.width,tif.height,
                       pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start);
    if (iVar3 < 1) {
      pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&planar,name,(allocator *)&local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format,
                     "Cannot load image ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&planar);
      gutil::IOException::IOException(pIVar4,(string *)&format);
      __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              (image,(ulong)tif.width,(ulong)tif.height,3);
    lVar6 = 0;
    lVar5 = image->width;
    if (image->width < 1) {
      lVar5 = lVar6;
    }
    lVar8 = image->height;
    if (image->height < 1) {
      lVar8 = lVar6;
    }
    for (; lVar6 != lVar8; lVar6 = lVar6 + 1) {
      pppuVar2 = image->img;
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        uVar1 = *pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*pppuVar2)[lVar6][lVar7] = (ushort)uVar1 & 0xff;
        pppuVar2[1][lVar6][lVar7] = (ushort)(uVar1 >> 8) & 0xff;
        pppuVar2[2][lVar6][lVar7] = (ushort)(uVar1 >> 0x10) & 0xff;
        pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&pixel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    if (1 < ds) {
      downscaleImage<unsigned_short>
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format,image,ds);
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::operator=
                (image,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format);
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format);
    }
    if (((local_1e8 == 0 && local_1f0 == 0) && (local_1f8 == image->width)) && (h == image->height))
    goto LAB_0013d080;
    cropImage<unsigned_short>
              ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format,image,
               local_1f0,local_1e8,local_1f8,h);
  }
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::operator=
            (image,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&format);
LAB_0013d080:
  anon_unknown_6::TiffImage<unsigned_short>::~TiffImage(&tif);
  return;
}

Assistant:

void TIFFImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y, long w, long h) const
{
  loadInternal(image, name, ds, x, y, w, h);
}